

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O0

bool Fossilize::json_value<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
               (VkPipelineShaderStageCreateInfo *pStages,uint32_t stageCount,
               MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc,Value *out_value)

{
  bool bVar1;
  unsigned_long value;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *size;
  GenericStringRef<char> local_190;
  GenericStringRef<char> local_180;
  GenericStringRef<char> local_170;
  GenericStringRef<char> local_160;
  GenericStringRef<char> local_150;
  undefined1 local_140 [8];
  Value map_entry;
  VkSpecializationMapEntry *e;
  undefined1 local_120 [4];
  uint32_t j;
  Value map_entries;
  GenericStringRef<char> local_f0;
  GenericStringRef<char> local_e0;
  undefined1 local_d0 [8];
  Value spec;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  local_b0;
  GenericStringRef<char> local_a0;
  StringRefType local_90;
  GenericStringRef<char> local_80;
  GenericStringRef<char> local_70;
  undefined1 local_60 [8];
  Value stage;
  VkPipelineShaderStageCreateInfo *s;
  undefined1 local_40 [4];
  uint32_t i;
  Value stages;
  Value *out_value_local;
  MemoryPoolAllocator<rapidjson::CrtAllocator> *alloc_local;
  uint32_t stageCount_local;
  VkPipelineShaderStageCreateInfo *pStages_local;
  
  stages.data_.o.members = (Member *)out_value;
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_40,kArrayType);
  for (s._4_4_ = 0; s._4_4_ < stageCount; s._4_4_ = s._4_4_ + 1) {
    stage.data_.s.str = (Ch *)(pStages + s._4_4_);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_60,kObjectType);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>(&local_70,(char (*) [6])0x3f7e7b);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<unsigned_int>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_60,&local_70,((stage.data_.o.members)->value).data_.s.length,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_80,(char (*) [5])0x3c2e53);
    rapidjson::StringRef<char>((rapidjson *)&local_90,*(char **)(stage.data_.s.str + 0x20));
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_60,&local_80,&local_90,alloc);
    rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_a0,(char (*) [7])0x3c677a);
    value = api_object_cast<unsigned_long,VkShaderModule_T*>
                      ((VkShaderModule_T *)((stage.data_.o.members)->value).data_.o.members);
    uint64_string<rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
              ((Fossilize *)&local_b0,value,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
               *)local_60,&local_a0,&local_b0,alloc);
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue(&local_b0);
    rapidjson::GenericStringRef<char>::GenericStringRef<6u>
              ((GenericStringRef<char> *)((long)&spec.data_ + 8),(char (*) [6])"stage");
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    AddMember<VkShaderStageFlagBits>
              ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                *)local_60,(StringRefType *)((long)&spec.data_ + 8),
               ((stage.data_.o.members)->value).data_.s.hashcode,alloc);
    if (*(long *)(stage.data_.s.str + 0x28) != 0) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_d0,kObjectType);
      rapidjson::GenericStringRef<char>::GenericStringRef<9u>(&local_e0,(char (*) [9])"dataSize");
      size = alloc;
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember<unsigned_long>
                ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_d0,&local_e0,
                 *(unsigned_long *)(*(long *)(stage.data_.s.str + 0x28) + 0x10),alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_f0,(char (*) [5])0x3ef420);
      encode_base64_abi_cxx11_
                ((string *)((long)&map_entries.data_ + 8),
                 *(Fossilize **)(*(long *)(stage.data_.s.str + 0x28) + 0x18),
                 *(void **)(*(long *)(stage.data_.s.str + 0x28) + 0x10),(size_t)size);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>::
      AddMember<std::__cxx11::string>
                ((GenericValue<rapidjson::UTF8<char>,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                  *)local_d0,&local_f0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 ((long)&map_entries.data_ + 8),alloc);
      std::__cxx11::string::~string((string *)(map_entries.data_.ss.str + 8));
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                      *)local_120,kArrayType);
      for (e._4_4_ = 0; e._4_4_ < **(uint **)(stage.data_.s.str + 0x28); e._4_4_ = e._4_4_ + 1) {
        map_entry.data_.s.str =
             (Ch *)(*(long *)(*(long *)(stage.data_.s.str + 0x28) + 8) + (ulong)e._4_4_ * 0x10);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                        *)local_140,kObjectType);
        rapidjson::GenericStringRef<char>::GenericStringRef<7u>(&local_150,(char (*) [7])0x3f273a);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_140,&local_150,((map_entry.data_.o.members)->name).data_.s.hashcode,
                   alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<5u>(&local_160,(char (*) [5])0x3fc978);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_long>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_140,&local_160,
                   (unsigned_long)((map_entry.data_.o.members)->name).data_.s.str,alloc);
        rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                  (&local_170,(char (*) [11])"constantID");
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::AddMember<unsigned_int>
                  ((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_140,&local_170,*(uint *)map_entry.data_.s.str,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_120,
                   (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                    *)local_140,alloc);
        rapidjson::
        GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
        ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                         *)local_140);
      }
      rapidjson::GenericStringRef<char>::GenericStringRef<11u>
                (&local_180,(char (*) [11])"mapEntries");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_d0,&local_180,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_120,alloc);
      rapidjson::GenericStringRef<char>::GenericStringRef<19u>
                (&local_190,(char (*) [19])"specializationInfo");
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::AddMember((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_60,&local_190,
                  (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_d0,alloc);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_120);
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                       *)local_d0);
    }
    bVar1 = pnext_chain_add_json_value<VkPipelineShaderStageCreateInfo,rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>>
                      ((Value *)local_60,(VkPipelineShaderStageCreateInfo *)stage.data_.o.members,
                       alloc,(DynamicStateInfo *)0x0);
    if (bVar1) {
      rapidjson::
      GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
      ::PushBack((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_40,
                 (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  *)local_60,alloc);
    }
    else {
      pStages_local._7_1_ = 0;
    }
    rapidjson::
    GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
    ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                   *)local_60);
    if (!bVar1) goto LAB_001c8e7e;
  }
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  operator=(stages.data_.a.elements,
            (GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             *)local_40);
  pStages_local._7_1_ = 1;
LAB_001c8e7e:
  rapidjson::
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>::
  ~GenericValue((GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 *)local_40);
  return (bool)(pStages_local._7_1_ & 1);
}

Assistant:

static bool json_value(const VkPipelineShaderStageCreateInfo *pStages, uint32_t stageCount,
                       Allocator &alloc, Value *out_value)
{
	Value stages(kArrayType);
	for (uint32_t i = 0; i < stageCount; i++)
	{
		auto &s = pStages[i];
		Value stage(kObjectType);
		stage.AddMember("flags", s.flags, alloc);
		stage.AddMember("name", StringRef(s.pName), alloc);
		stage.AddMember("module", uint64_string(api_object_cast<uint64_t>(s.module), alloc), alloc);
		stage.AddMember("stage", s.stage, alloc);
		if (s.pSpecializationInfo)
		{
			Value spec(kObjectType);
			spec.AddMember("dataSize", uint64_t(s.pSpecializationInfo->dataSize), alloc);
			spec.AddMember("data",
			               encode_base64(s.pSpecializationInfo->pData,
			                             s.pSpecializationInfo->dataSize), alloc);
			Value map_entries(kArrayType);
			for (uint32_t j = 0; j < s.pSpecializationInfo->mapEntryCount; j++)
			{
				auto &e = s.pSpecializationInfo->pMapEntries[j];
				Value map_entry(kObjectType);
				map_entry.AddMember("offset", e.offset, alloc);
				map_entry.AddMember("size", uint64_t(e.size), alloc);
				map_entry.AddMember("constantID", e.constantID, alloc);
				map_entries.PushBack(map_entry, alloc);
			}
			spec.AddMember("mapEntries", map_entries, alloc);
			stage.AddMember("specializationInfo", spec, alloc);
		}

		if (!pnext_chain_add_json_value(stage, s, alloc, nullptr))
			return false;
		stages.PushBack(stage, alloc);
	}

	*out_value = stages;
	return true;
}